

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_clause.cpp
# Opt level: O1

string * __thiscall
duckdb::AtClause::ToString_abi_cxx11_(string *__return_storage_ptr__,AtClause *this)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  pointer pPVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,"AT (",&this->unit);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_38);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_68 = *puVar6;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar6;
    local_78 = (ulong *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expr);
  (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_58,pPVar4);
  uVar8 = 0xf;
  if (local_78 != &local_68) {
    uVar8 = local_68;
  }
  if (uVar8 < (ulong)(local_50 + local_70)) {
    uVar8 = 0xf;
    if (local_58 != local_48) {
      uVar8 = local_48[0];
    }
    if ((ulong)(local_50 + local_70) <= uVar8) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_0078ed6e;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
LAB_0078ed6e:
  local_98 = &local_88;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_88 = *puVar1;
    uStack_80 = puVar5[3];
  }
  else {
    local_88 = *puVar1;
    local_98 = (undefined8 *)*puVar5;
  }
  local_90 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string AtClause::ToString() const {
	return "AT (" + unit + " => " + expr->ToString() + ")";
}